

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O3

void __thiscall
burst::k_ary_search_set<int,std::greater<void>>::
fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
          (k_ary_search_set<int,std::greater<void>> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters,
          iterator_range<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *range)

{
  int *piVar1;
  int iVar2;
  reference piVar3;
  size_t sVar4;
  int *piVar5;
  int *piVar6;
  pointer puVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  ulong uVar11;
  
  puVar7 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar7 == 8) {
    lVar8 = *(long *)this;
    sVar4 = branch->index;
    lVar9 = 1;
  }
  else {
    uVar11 = 0;
    do {
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
               ::operator[](&range->
                             super_iterator_range_base<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_boost::iterators::random_access_traversal_tag>
                            ,puVar7[uVar11] + branch->preceding_elements);
      sVar4 = branch->index;
      lVar8 = *(long *)this;
      *(int *)(lVar8 + sVar4 * 4 + uVar11 * 4) = *piVar3;
      uVar11 = uVar11 + 1;
      puVar7 = (counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_start;
      lVar9 = (long)(counters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 3;
    } while (uVar11 < lVar9 - 1U);
  }
  piVar10 = (int *)(lVar8 + sVar4 * 4);
  piVar5 = piVar10 + lVar9 + -1;
  if (piVar10 != piVar5) {
    lVar8 = lVar9 * 4 + -8;
    piVar6 = piVar10;
    do {
      if (lVar8 == 0) {
        return;
      }
      piVar10 = piVar6 + 1;
      piVar1 = piVar6 + 1;
      lVar8 = lVar8 + -4;
      iVar2 = *piVar6;
      piVar6 = piVar10;
    } while (*piVar1 <= iVar2);
  }
  if (piVar10 == piVar5) {
    return;
  }
  __assert_fail("std::is_sorted ( m_values.begin() + static_cast<difference_type>(branch.index), m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1), m_compare )"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                ,0x1bc,
                "void burst::k_ary_search_set<int, std::greater<void>>::fill_node(const k_ary_search_set_branch &, const std::vector<std::size_t> &, const RandomAccessRange &) [Value = int, Compare = std::greater<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<int *, std::vector<int>>>]"
               );
}

Assistant:

void
            fill_node
            (
                const k_ary_search_set_branch & branch,
                const std::vector<std::size_t> & counters,
                const RandomAccessRange & range
            )
        {
            for
            (
                std::size_t element_index = 0;
                element_index < counters.size() - 1;
                ++element_index
            )
            {
                using difference_type = typename RandomAccessRange::difference_type;
                const auto index_in_initial_range =
                    static_cast<difference_type>
                    (
                        branch.preceding_elements + counters[element_index]
                    );
                m_values[branch.index + element_index] = range[index_in_initial_range];
            }
            BOOST_ASSERT(std::is_sorted
            (
                m_values.begin() + static_cast<difference_type>(branch.index),
                m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1),
                m_compare
            ));
        }